

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_count.cpp
# Opt level: O2

void __thiscall
BitCount_PopCountUInt_Test::BitCount_PopCountUInt_Test(BitCount_PopCountUInt_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0020de48;
  return;
}

Assistant:

TEST (BitCount, PopCountUInt) {
    std::uint32_t bitmap = 0;
    EXPECT_EQ (0U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xF0;
    EXPECT_EQ (4U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xFFFFFFFF;
    EXPECT_EQ (32U, pstore::bit_count::pop_count (bitmap));
}